

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool ON_ViewportFromRhinoView
               (view_projection projection,ON_3dPoint *rhvp_target,double rhvp_angle1,
               double rhvp_angle2,double rhvp_angle3,double rhvp_viewsize,double rhvp_cameradist,
               int screen_width,int screen_height,ON_Viewport *vp)

{
  ON_3dVector axis;
  ON_3dVector axis_00;
  ON_3dVector axis_01;
  ON_3dPoint center;
  ON_3dPoint center_00;
  ON_3dPoint center_01;
  bool bVar1;
  int iVar2;
  double local_4d8;
  double local_4d0;
  ON_3dVector local_4b0;
  ON_3dVector local_498;
  ON_3dPoint local_480;
  ON_3dVector local_468;
  ON_3dVector local_450;
  ON_3dVector local_438;
  ON_Xform local_420;
  ON_Xform local_3a0;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double far_clipping_distance;
  double near_clipping_distance;
  double frustum_top;
  double frustum_bottom;
  double frustum_right;
  double frustum_left;
  ON_Xform RhinoRot;
  ON_Xform R3;
  ON_Xform R2;
  ON_Xform R1;
  double width;
  double height;
  ON_Viewport *vp_local;
  int screen_height_local;
  int screen_width_local;
  double rhvp_cameradist_local;
  double rhvp_viewsize_local;
  double rhvp_angle3_local;
  double rhvp_angle2_local;
  double rhvp_angle1_local;
  ON_3dPoint *rhvp_target_local;
  view_projection projection_local;
  
  ON_Viewport::SetProjection(vp,projection);
  if ((screen_width < 1) || (screen_height < 1)) {
    local_4d0 = 1000.0;
  }
  else {
    local_4d0 = (double)screen_height;
  }
  if ((screen_width < 1) || (screen_height < 1)) {
    local_4d8 = 1000.0;
  }
  else {
    local_4d8 = (double)screen_width;
  }
  ON_Xform::ON_Xform((ON_Xform *)(R2.m_xform[3] + 3));
  ON_Xform::ON_Xform((ON_Xform *)(R3.m_xform[3] + 3));
  ON_Xform::ON_Xform((ON_Xform *)(RhinoRot.m_xform[3] + 3));
  ON_Xform::ON_Xform((ON_Xform *)&frustum_left);
  if (1.0 <= local_4d0) {
    if (1.0 <= local_4d8) {
      if (0.0 < rhvp_viewsize) {
        if (0.0 < rhvp_cameradist) {
          local_2a8 = ON_3dVector::ZAxis.x;
          local_2a0 = ON_3dVector::ZAxis.y;
          local_298 = ON_3dVector::ZAxis.z;
          local_2c0 = ON_3dPoint::Origin.x;
          local_2b8 = ON_3dPoint::Origin.y;
          local_2b0 = ON_3dPoint::Origin.z;
          axis.y = ON_3dVector::ZAxis.y;
          axis.x = ON_3dVector::ZAxis.x;
          axis.z = ON_3dVector::ZAxis.z;
          center.y = ON_3dPoint::Origin.y;
          center.x = ON_3dPoint::Origin.x;
          center.z = ON_3dPoint::Origin.z;
          ON_Xform::Rotation((ON_Xform *)(R2.m_xform[3] + 3),rhvp_angle1,axis,center);
          local_2d8 = ON_3dVector::XAxis.x;
          local_2d0 = ON_3dVector::XAxis.y;
          local_2c8 = ON_3dVector::XAxis.z;
          local_2f0 = ON_3dPoint::Origin.x;
          local_2e8 = ON_3dPoint::Origin.y;
          local_2e0 = ON_3dPoint::Origin.z;
          axis_00.y = ON_3dVector::XAxis.y;
          axis_00.x = ON_3dVector::XAxis.x;
          axis_00.z = ON_3dVector::XAxis.z;
          center_00.y = ON_3dPoint::Origin.y;
          center_00.x = ON_3dPoint::Origin.x;
          center_00.z = ON_3dPoint::Origin.z;
          ON_Xform::Rotation((ON_Xform *)(R3.m_xform[3] + 3),rhvp_angle2,axis_00,center_00);
          local_308 = ON_3dVector::ZAxis.x;
          local_300 = ON_3dVector::ZAxis.y;
          local_2f8 = ON_3dVector::ZAxis.z;
          local_320 = ON_3dPoint::Origin.x;
          local_318 = ON_3dPoint::Origin.y;
          local_310 = ON_3dPoint::Origin.z;
          axis_01.y = ON_3dVector::ZAxis.y;
          axis_01.x = ON_3dVector::ZAxis.x;
          axis_01.z = ON_3dVector::ZAxis.z;
          center_01.y = ON_3dPoint::Origin.y;
          center_01.x = ON_3dPoint::Origin.x;
          center_01.z = ON_3dPoint::Origin.z;
          ON_Xform::Rotation((ON_Xform *)(RhinoRot.m_xform[3] + 3),rhvp_angle3,axis_01,center_01);
          ON_Xform::operator*(&local_420,(ON_Xform *)(RhinoRot.m_xform[3] + 3),
                              (ON_Xform *)(R3.m_xform[3] + 3));
          ON_Xform::operator*(&local_3a0,&local_420,(ON_Xform *)(R2.m_xform[3] + 3));
          memcpy(&frustum_left,&local_3a0,0x80);
          ON_Xform::operator*(&local_438,(ON_Xform *)&frustum_left,&ON_3dVector::YAxis);
          ON_Viewport::SetCameraUp(vp,&local_438);
          ON_Xform::operator*(&local_468,(ON_Xform *)&frustum_left,&ON_3dVector::ZAxis);
          ON_3dVector::operator-(&local_450,&local_468);
          ON_Viewport::SetCameraDirection(vp,&local_450);
          ON_Viewport::CameraDirection(&local_4b0,vp);
          operator*(&local_498,rhvp_cameradist,&local_4b0);
          ON_3dPoint::operator-(&local_480,rhvp_target,&local_498);
          ON_Viewport::SetCameraLocation(vp,&local_480);
          ON_Viewport::SetTargetPoint(vp,*rhvp_target);
          far_clipping_distance = rhvp_cameradist / 64.0;
          if (1.0 < far_clipping_distance) {
            far_clipping_distance = 1.0;
          }
          local_290 = rhvp_cameradist * 4.0;
          if (local_4d0 < local_4d8) {
            frustum_bottom = (rhvp_viewsize * local_4d8) / local_4d0;
            near_clipping_distance = rhvp_viewsize;
          }
          else {
            near_clipping_distance = (rhvp_viewsize * local_4d0) / local_4d8;
            frustum_bottom = rhvp_viewsize;
          }
          bVar1 = ON_Viewport::IsPerspectiveProjection(vp);
          if (bVar1) {
            frustum_bottom = far_clipping_distance * frustum_bottom;
            near_clipping_distance = far_clipping_distance * near_clipping_distance;
          }
          frustum_right = -frustum_bottom;
          frustum_top = -near_clipping_distance;
          ON_Viewport::SetFrustum
                    (vp,frustum_right,frustum_bottom,frustum_top,near_clipping_distance,
                     far_clipping_distance,local_290);
          ON_Viewport::SetScreenPort(vp,0,(int)local_4d8,(int)local_4d0,0,0,0xffff);
          iVar2 = (*(vp->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(vp,0);
          rhvp_target_local._7_1_ = (bool)(-(char)iVar2 & 1);
        }
        else {
          rhvp_target_local._7_1_ = false;
        }
      }
      else {
        rhvp_target_local._7_1_ = false;
      }
    }
    else {
      rhvp_target_local._7_1_ = false;
    }
  }
  else {
    rhvp_target_local._7_1_ = false;
  }
  return rhvp_target_local._7_1_;
}

Assistant:

bool ON_ViewportFromRhinoView(
        ON::view_projection projection,
        const ON_3dPoint& rhvp_target, // 3d point
        double rhvp_angle1, double rhvp_angle2, double rhvp_angle3, // radians
        double rhvp_viewsize,     // > 0
        double rhvp_cameradist,   // > 0
        int screen_width, int screen_height,
        ON_Viewport& vp
        )
/*****************************************************************************
Compute canonical view projection information from Rhino viewport settings
INPUT:
  projection
  rhvp_target
    Rhino viewport target point (3d point that is center of view rotations)
  rhvp_angle1, rhvp_angle2, rhvp_angle3
    Rhino viewport angle settings
  rhvp_viewsize 
    In perspective, rhvp_viewsize = tangent(half lens angle).
    In parallel, rhvp_viewsize = 1/2 * minimum(frustum width,frustum height)
  rhvp_cameradistance ( > 0 )
    Distance from camera location to Rhino's "target" point
  screen_width, screen_height (0,0) if not known
*****************************************************************************/
{
  vp.SetProjection( projection );
  /*
  width, height
    width and height of viewport  
    ( = RhinoViewport->width, RhinoViewport->height )
  z_buffer_depth
    depth for the z buffer.  0xFFFF is currently used for Rhino
    quick rendering.
  */

  // In the situation where there is no physical display device, assume a
  // 1000 x 1000 "screen" and set the parameters accordingly.  Toolkit users
  // that are using this class to actually draw a picture, can make a subsequent
  // call to SetScreenPort().

  const double height = (screen_width < 1 || screen_height < 1) 
                      ? 1000.0 : (double)screen_height;
  const double width  = (screen_width < 1 || screen_height < 1) 
                      ? 1000.0 : (double)screen_width;
  //const int z_buffer_depth = 0xFFFF; // value Rhino "Shade" command uses

  // Use this function to obtain standard view information from a Rhino VIEWPORT
  // view. The Rhino viewport has many entries.  As of 17 October, 1997 all Rhino
  // world to clipping transformation information is derived from the VIEWPORT 
  // fields:
  //
  //   target, angle1, angle2, angle3, viewsize, and cameradist.
  //
  // The width, height and zbuffer_depth arguments are used to determine the
  // clipping to screen transformation.

  ON_Xform R1, R2, R3, RhinoRot;
  double frustum_left, frustum_right, frustum_bottom, frustum_top;
  double near_clipping_distance, far_clipping_distance;

  // Initialize default view in case input is garbage.
  if (height < 1)
    return false;
  if ( width < 1 )
    return false;
  if ( rhvp_viewsize <= 0.0 )
    return false;
  if ( rhvp_cameradist <= 0.0 )
    return false;

  // A Rhino 1.0 VIEWPORT structure describes the camera's location, direction,
  // and  orientation by specifying a rotation transformation that is
  // applied to an initial frame.  The rotation transformation is defined
  // as a sequence of 3 rotations abount fixed axes.  The initial frame
  // has the camera located at (0,0,cameradist), pointed in the direction
  // (0,0,-1), and oriented so that up is (0,1,0).

  R1.Rotation( rhvp_angle1, ON_3dVector::ZAxis, ON_3dPoint::Origin ); // so called "twist"
  R2.Rotation( rhvp_angle2, ON_3dVector::XAxis, ON_3dPoint::Origin ); // so called "elevation"
  R3.Rotation( rhvp_angle3, ON_3dVector::ZAxis, ON_3dPoint::Origin ); // so called "fudge factor"
  RhinoRot = R3 * R2 * R1;

  vp.SetCameraUp( RhinoRot*ON_3dVector::YAxis );
  vp.SetCameraDirection( -(RhinoRot*ON_3dVector::ZAxis) );
  vp.SetCameraLocation( rhvp_target - rhvp_cameradist*vp.CameraDirection() );
  vp.SetTargetPoint( rhvp_target );
  //vp.SetTargetDistance( rhvp_cameradist );

  // Camera coordinates "X" = CameraRight = CameraDirection x CameraUp
  // Camera coordinates "Y" = CameraUp
  // Camera coordinates "Z" = -CameraDirection

  // Rhino 1.0 did not support skew projections.  In other words, the
  // view frustum is symmetric and ray that begins at CameraLocation and 
  // goes along CameraDirection runs along the frustum's central axis.
  // The aspect ratio of the view frustum equals 
  // (screen port width)/(screen port height)
  // This means frus_left = -frus_right, frus_bottom = -frus_top, and
  // frus_top/frus_right = height/width

  // Set near and far clipping planes to some reasonable values.  If
  // the depth of the pixel is important, then the near and far clipping
  // plane will need to be adjusted later.
  // Rhino 1.0 didn't have a far clipping plane in wire frame (which explains
  // why you can get perspective views reversed through the origin by using 
  // the SetCameraTarget() command.  It's near clipping plane is set to 
  // a minuscule value.  For mesh rendering, it must come up with some
  // sort of reasonable near and far clipping planes because the zbuffer
  // is used correctly.  When time permits, I'll dig through the rendering
  // code and determine what values are being used.
  //
  near_clipping_distance = rhvp_cameradist/64.0;
  if ( near_clipping_distance > 1.0 )
    near_clipping_distance = 1.0;
  far_clipping_distance = 4.0*rhvp_cameradist;


  if ( width <= height )
  {
    frustum_right = rhvp_viewsize;
    frustum_top = frustum_right*height/width;
  }
  else
  {
    frustum_top = rhvp_viewsize;
    frustum_right = frustum_top*width/height;
  }
  if ( vp.IsPerspectiveProjection() )
  {
    frustum_right *= near_clipping_distance;
    frustum_top   *= near_clipping_distance;
  }
  frustum_left   = -frustum_right;
  frustum_bottom = -frustum_top;


  vp.SetFrustum( 
         frustum_left,   frustum_right, 
         frustum_bottom, frustum_top, 
         near_clipping_distance, far_clipping_distance );

  // Windows specific stuff that requires knowing size of client area in pixels
  vp.SetScreenPort( 0, (int)width, // windows has screen X increasing accross
                    (int)height,  0, // windows has screen Y increasing downwards
                    0, 0xFFFF );

  return (vp.IsValid()?true:false);
}